

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void close_all_listening_sockets(mg_context *ctx)

{
  uint local_14;
  uint i;
  mg_context *ctx_local;
  
  if (ctx != (mg_context *)0x0) {
    for (local_14 = 0; local_14 < ctx->num_listening_sockets; local_14 = local_14 + 1) {
      close(ctx->listening_sockets[local_14].sock);
      ctx->listening_sockets[local_14].sock = -1;
    }
    mg_free(ctx->listening_sockets);
    ctx->listening_sockets = (socket *)0x0;
    mg_free(ctx->listening_socket_fds);
    ctx->listening_socket_fds = (pollfd *)0x0;
  }
  return;
}

Assistant:

static void
close_all_listening_sockets(struct mg_context *ctx)
{
	unsigned int i;
	if (!ctx) {
		return;
	}

	for (i = 0; i < ctx->num_listening_sockets; i++) {
		closesocket(ctx->listening_sockets[i].sock);
#if defined(USE_X_DOM_SOCKET)
		/* For unix domain sockets, the socket name represents a file that has
		 * to be deleted. */
		/* See
		 * https://stackoverflow.com/questions/15716302/so-reuseaddr-and-af-unix
		 */
		if ((ctx->listening_sockets[i].lsa.sin.sin_family == AF_UNIX)
		    && (ctx->listening_sockets[i].sock != INVALID_SOCKET)) {
			IGNORE_UNUSED_RESULT(
			    remove(ctx->listening_sockets[i].lsa.sun.sun_path));
		}
#endif
		ctx->listening_sockets[i].sock = INVALID_SOCKET;
	}
	mg_free(ctx->listening_sockets);
	ctx->listening_sockets = NULL;
	mg_free(ctx->listening_socket_fds);
	ctx->listening_socket_fds = NULL;
}